

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

bool highsPause(bool pause_condition,string *message)

{
  char *pcVar1;
  undefined7 in_register_00000039;
  char str [100];
  
  if ((int)CONCAT71(in_register_00000039,pause_condition) != 0) {
    printf("Satisfying highsPause(\"%s\")\n",(message->_M_dataplus)._M_p);
    printf("Enter any value to continue:");
    fflush(_stdout);
    pcVar1 = fgets(str,100,_stdin);
    if (pcVar1 != (char *)0x0) {
      printf("You entered: \"%s\"\n",str);
      fflush(_stdout);
    }
  }
  return pause_condition;
}

Assistant:

bool highsPause(const bool pause_condition, const std::string message) {
  if (!pause_condition) return pause_condition;
  printf("Satisfying highsPause(\"%s\")\n", message.c_str());
  char str[100];
  printf("Enter any value to continue:");
  fflush(stdout);
  if (fgets(str, 100, stdin) != nullptr) {
    printf("You entered: \"%s\"\n", str);
    fflush(stdout);
  }
  return pause_condition;
}